

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.h
# Opt level: O2

string * google::protobuf::compiler::cpp::Formatter::Payload<google::protobuf::Descriptor>
                   (string *__return_storage_ptr__,Descriptor *descriptor)

{
  pointer piVar1;
  undefined8 *puVar2;
  vector<int,_std::allocator<int>_> *__range4;
  pointer piVar3;
  vector<int,_std::allocator<int>_> path;
  Annotation annotation;
  _Vector_base<int,_std::allocator<int>_> local_88;
  GeneratedCodeInfo_Annotation local_68;
  
  local_88._M_impl.super__Vector_impl_data._M_start = (int32_t *)0x0;
  local_88._M_impl.super__Vector_impl_data._M_finish = (int32_t *)0x0;
  local_88._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Descriptor::GetLocationPath(descriptor,(vector<int,_std::allocator<int>_> *)&local_88);
  GeneratedCodeInfo_Annotation::GeneratedCodeInfo_Annotation(&local_68);
  piVar1 = local_88._M_impl.super__Vector_impl_data._M_finish;
  for (piVar3 = local_88._M_impl.super__Vector_impl_data._M_start; piVar3 != piVar1;
      piVar3 = piVar3 + 1) {
    GeneratedCodeInfo_Annotation::_internal_add_path(&local_68,*piVar3);
  }
  local_68._has_bits_.has_bits_[0] = (uint32_t  [1])((uint)local_68._has_bits_.has_bits_[0] | 1);
  puVar2 = (undefined8 *)
           (local_68.super_Message.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
  if ((local_68.super_Message.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
    puVar2 = (undefined8 *)*puVar2;
  }
  internal::ArenaStringPtr::Set(&local_68.source_file_,**(undefined8 **)(descriptor + 0x10),puVar2);
  MessageLite::SerializeAsString_abi_cxx11_(__return_storage_ptr__,(MessageLite *)&local_68);
  GeneratedCodeInfo_Annotation::~GeneratedCodeInfo_Annotation(&local_68);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_88);
  return __return_storage_ptr__;
}

Assistant:

static std::string Payload(const Descriptor* descriptor) {
    std::vector<int> path;
    descriptor->GetLocationPath(&path);
    GeneratedCodeInfo::Annotation annotation;
    for (int index : path) {
      annotation.add_path(index);
    }
    annotation.set_source_file(descriptor->file()->name());
    return annotation.SerializeAsString();
  }